

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O3

void __thiscall
cmFindLibraryHelper::cmFindLibraryHelper
          (cmFindLibraryHelper *this,string *debugName,cmMakefile *mf,cmFindBase *base)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmFindLibraryHelper *pcVar2;
  cmMakefile *this_00;
  bool bVar3;
  cmGlobalGenerator *pcVar4;
  cmValue cVar5;
  cmValue cVar6;
  cmState *this_01;
  cmMakefile *pcVar7;
  cmFindLibraryHelper *this_02;
  string_view arg;
  string_view arg_00;
  size_type __dnew;
  undefined1 local_b0 [32];
  cmMakefile *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70;
  string *local_68;
  string *local_60;
  cmFindBaseDebugState *local_58;
  string local_50;
  
  this->Makefile = mf;
  this->FindBase = base;
  local_70 = &(this->PrefixRegexStr).field_2;
  (this->Prefixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Prefixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Prefixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->Suffixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Suffixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Suffixes).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->PrefixRegexStr)._M_dataplus._M_p = (pointer)local_70;
  (this->PrefixRegexStr)._M_string_length = 0;
  (this->PrefixRegexStr).field_2._M_local_buf[0] = '\0';
  local_78 = &(this->SuffixRegexStr).field_2;
  (this->SuffixRegexStr)._M_dataplus._M_p = (pointer)local_78;
  (this->SuffixRegexStr)._M_string_length = 0;
  (this->SuffixRegexStr).field_2._M_local_buf[0] = '\0';
  local_80 = &(this->BestPath).field_2;
  (this->BestPath)._M_dataplus._M_p = (pointer)local_80;
  (this->BestPath)._M_string_length = 0;
  (this->BestPath).field_2._M_local_buf[0] = '\0';
  this->DebugMode = (base->super_cmFindCommon).DebugMode;
  (this->Names).
  super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Names).
  super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Names).
  super__Vector_base<cmFindLibraryHelper::Name,_std::allocator<cmFindLibraryHelper::Name>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88 = &(this->TestPath).field_2;
  (this->TestPath)._M_dataplus._M_p = (pointer)local_88;
  (this->TestPath)._M_string_length = 0;
  (this->TestPath).field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (debugName->_M_dataplus)._M_p;
  paVar1 = &debugName->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == paVar1) {
    local_50.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_50.field_2._8_8_ = *(undefined8 *)((long)&debugName->field_2 + 8);
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  }
  else {
    local_50.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  local_60 = &this->PrefixRegexStr;
  local_68 = &this->SuffixRegexStr;
  local_50._M_string_length = debugName->_M_string_length;
  (debugName->_M_dataplus)._M_p = (pointer)paVar1;
  debugName->_M_string_length = 0;
  (debugName->field_2)._M_local_buf[0] = '\0';
  cmFindBaseDebugState::cmFindBaseDebugState(&this->DebugSearches,&local_50,base);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pcVar7 = this->Makefile;
  local_58 = &this->DebugSearches;
  pcVar4 = cmMakefile::GetGlobalGenerator(pcVar7);
  this->GG = pcVar4;
  this_00 = this->Makefile;
  if ((anonymous_namespace)::get_prefixes[abi:cxx11](cmMakefile*)::defaultPrefix_abi_cxx11_ == '\0')
  {
    cmFindLibraryHelper((cmFindLibraryHelper *)pcVar7);
  }
  pcVar2 = (cmFindLibraryHelper *)(local_b0 + 0x10);
  local_90 = (cmMakefile *)0x1b;
  local_b0._0_8_ = pcVar2;
  local_b0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_b0,(ulong)&local_90);
  local_b0._16_8_ = local_90;
  builtin_strncpy((char *)((long)&((cmFindLibraryHelper *)local_b0._0_8_)->FindBase + 3),"LIBRARY_",
                  8);
  builtin_strncpy((char *)((long)&((cmFindLibraryHelper *)local_b0._0_8_)->GG + 3),"PREFIXES",8);
  ((cmFindLibraryHelper *)local_b0._0_8_)->Makefile = (cmMakefile *)0x49465f454b414d43;
  ((cmFindLibraryHelper *)local_b0._0_8_)->FindBase = (cmFindBase *)0x415242494c5f444e;
  local_b0._8_8_ = local_90;
  *(undefined1 *)
   ((long)&(local_90->FindPackageRootPathStack).
           super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Deque_impl_data._M_map +
   (long)&((cmFindLibraryHelper *)local_b0._0_8_)->Makefile) = 0;
  cVar5 = cmMakefile::GetDefinition(this_00,(string *)local_b0);
  this_02 = (cmFindLibraryHelper *)local_b0._0_8_;
  if ((cmFindLibraryHelper *)local_b0._0_8_ != pcVar2) {
    operator_delete((void *)local_b0._0_8_,(ulong)(local_b0._16_8_ + 1));
  }
  cVar6.Value = (string *)
                (anonymous_namespace)::get_prefixes[abi:cxx11](cmMakefile*)::
                defaultPrefix_abi_cxx11_;
  if (cVar5.Value != (string *)0x0) {
    cVar6 = cVar5;
  }
  pcVar7 = this->Makefile;
  if ((anonymous_namespace)::get_suffixes[abi:cxx11](cmMakefile*)::defaultSuffix_abi_cxx11_ == '\0')
  {
    cmFindLibraryHelper(this_02);
  }
  local_90 = (cmMakefile *)0x1b;
  local_b0._0_8_ = pcVar2;
  local_b0._0_8_ = std::__cxx11::string::_M_create((ulong *)local_b0,(ulong)&local_90);
  local_b0._16_8_ = local_90;
  builtin_strncpy((char *)((long)&((cmFindLibraryHelper *)local_b0._0_8_)->FindBase + 3),"LIBRARY_",
                  8);
  builtin_strncpy((char *)((long)&((cmFindLibraryHelper *)local_b0._0_8_)->GG + 3),"SUFFIXES",8);
  ((cmFindLibraryHelper *)local_b0._0_8_)->Makefile = (cmMakefile *)0x49465f454b414d43;
  ((cmFindLibraryHelper *)local_b0._0_8_)->FindBase = (cmFindBase *)0x415242494c5f444e;
  local_b0._8_8_ = local_90;
  *(undefined1 *)
   ((long)&(local_90->FindPackageRootPathStack).
           super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ._M_impl.super__Deque_impl_data._M_map +
   (long)&((cmFindLibraryHelper *)local_b0._0_8_)->Makefile) = 0;
  cVar5 = cmMakefile::GetDefinition(pcVar7,(string *)local_b0);
  if ((cmFindLibraryHelper *)local_b0._0_8_ != pcVar2) {
    operator_delete((void *)local_b0._0_8_,(ulong)(local_b0._16_8_ + 1));
  }
  arg._M_str = ((cVar6.Value)->_M_dataplus)._M_p;
  arg._M_len = (cVar6.Value)->_M_string_length;
  cmExpandList(arg,&this->Prefixes,true);
  cVar6.Value = (string *)
                &(anonymous_namespace)::get_suffixes[abi:cxx11](cmMakefile*)::
                 defaultSuffix_abi_cxx11_;
  if (cVar5.Value != (string *)0x0) {
    cVar6 = cVar5;
  }
  arg_00._M_str = ((cVar6.Value)->_M_dataplus)._M_p;
  arg_00._M_len = (cVar6.Value)->_M_string_length;
  cmExpandList(arg_00,&this->Suffixes,true);
  RegexFromList(this,local_60,&this->Prefixes);
  RegexFromList(this,local_68,&this->Suffixes);
  this_01 = cmMakefile::GetState(this->Makefile);
  local_b0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_b0,"FIND_LIBRARY_USE_OPENBSD_VERSIONING","");
  bVar3 = cmState::GetGlobalPropertyAsBool(this_01,(string *)local_b0);
  this->OpenBSD = bVar3;
  if ((cmFindLibraryHelper *)local_b0._0_8_ != pcVar2) {
    operator_delete((void *)local_b0._0_8_,(ulong)(local_b0._16_8_ + 1));
  }
  return;
}

Assistant:

cmFindLibraryHelper::cmFindLibraryHelper(std::string debugName, cmMakefile* mf,
                                         cmFindBase const* base)
  : Makefile(mf)
  , FindBase(base)
  , DebugMode(base->DebugModeEnabled())
  , DebugSearches(std::move(debugName), base)
{
  this->GG = this->Makefile->GetGlobalGenerator();

  // Collect the list of library name prefixes/suffixes to try.
  std::string const& prefixes_list = get_prefixes(this->Makefile);
  std::string const& suffixes_list = get_suffixes(this->Makefile);

  cmExpandList(prefixes_list, this->Prefixes, true);
  cmExpandList(suffixes_list, this->Suffixes, true);
  this->RegexFromList(this->PrefixRegexStr, this->Prefixes);
  this->RegexFromList(this->SuffixRegexStr, this->Suffixes);

  // Check whether to use OpenBSD-style library version comparisons.
  this->OpenBSD = this->Makefile->GetState()->GetGlobalPropertyAsBool(
    "FIND_LIBRARY_USE_OPENBSD_VERSIONING");
}